

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_copy_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  CONV_BUF_TYPE *pCVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  CONV_BUF_TYPE *pCVar7;
  uint16_t uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint16_t *puVar12;
  uint uVar13;
  int iVar14;
  
  cVar5 = (char)conv_params->round_0 + (char)conv_params->round_1;
  cVar4 = (char)bd - cVar5;
  if (0 < h) {
    pCVar3 = conv_params->dst;
    bVar6 = 0xe - cVar5;
    iVar14 = (1 << (cVar4 + 0xdU & 0x1f)) + (1 << (cVar4 + 0xeU & 0x1f));
    iVar1 = conv_params->dst_stride;
    uVar11 = 0;
    pCVar7 = pCVar3;
    do {
      if (0 < w) {
        iVar2 = conv_params->do_average;
        uVar10 = 0;
        do {
          uVar9 = ((uint)src[uVar10] << (bVar6 & 0x1f)) + iVar14;
          puVar12 = pCVar3 + uVar11 * (long)iVar1;
          uVar8 = (uint16_t)uVar9;
          if (iVar2 != 0) {
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar9 = (uVar9 & 0xffff) + (uint)pCVar7[uVar10] >> 1;
            }
            else {
              uVar9 = (int)((uVar9 & 0xffff) * conv_params->bck_offset +
                           (uint)pCVar7[uVar10] * conv_params->fwd_offset) >> 4;
            }
            uVar13 = (int)(uVar9 + (((1 << (bVar6 & 0x1f)) >> 1) - iVar14)) >> (bVar6 & 0x1f);
            uVar9 = uVar13;
            if (bd == 10) {
              if (0x3fe < uVar13) {
                uVar9 = 0x3ff;
              }
            }
            else if (bd == 0xc) {
              if (0xffe < uVar13) {
                uVar9 = 0xfff;
              }
            }
            else if (0xfe < uVar13) {
              uVar9 = 0xff;
            }
            puVar12 = dst + uVar11 * (long)dst_stride;
            uVar8 = 0;
            if (-1 < (int)uVar13) {
              uVar8 = (uint16_t)uVar9;
            }
          }
          puVar12[uVar10] = uVar8;
          uVar10 = uVar10 + 1;
        } while ((uint)w != uVar10);
      }
      uVar11 = uVar11 + 1;
      pCVar7 = pCVar7 + iVar1;
      src = src + src_stride;
    } while (uVar11 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_c(const uint16_t *src, int src_stride,
                                            uint16_t *dst, int dst_stride,
                                            int w, int h,
                                            ConvolveParams *conv_params,
                                            int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  assert(bits >= 0);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}